

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte bVar1;
  byte *pbVar2;
  ulong uStack_30;
  uchar b1;
  size_t lenleft;
  uchar *sigend_local;
  uchar **sigp_local;
  size_t *len_local;
  
  *len = 0;
  if (*sigp < sigend) {
    pbVar2 = *sigp;
    *sigp = pbVar2 + 1;
    bVar1 = *pbVar2;
    if (bVar1 == 0xff) {
      len_local._4_4_ = 0;
    }
    else if ((bVar1 & 0x80) == 0) {
      *len = (ulong)bVar1;
      len_local._4_4_ = 1;
    }
    else if (bVar1 == 0x80) {
      len_local._4_4_ = 0;
    }
    else {
      uStack_30 = (ulong)(int)(bVar1 & 0x7f);
      if ((ulong)((long)sigend - (long)*sigp) < uStack_30) {
        len_local._4_4_ = 0;
      }
      else if (**sigp == '\0') {
        len_local._4_4_ = 0;
      }
      else if (uStack_30 < 9) {
        for (; uStack_30 != 0; uStack_30 = uStack_30 - 1) {
          *len = *len << 8 | (ulong)**sigp;
          *sigp = *sigp + 1;
        }
        if ((ulong)((long)sigend - (long)*sigp) < *len) {
          len_local._4_4_ = 0;
        }
        else if (*len < 0x80) {
          len_local._4_4_ = 0;
        }
        else {
          len_local._4_4_ = 1;
        }
      }
      else {
        len_local._4_4_ = 0;
      }
    }
  }
  else {
    len_local._4_4_ = 0;
  }
  return len_local._4_4_;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array. */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}